

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O2

int X509_STORE_CTX_get1_issuer(X509 **issuer,X509_STORE_CTX *ctx,X509 *x)

{
  int iVar1;
  X509_NAME *name;
  size_t sVar2;
  X509_OBJECT *a;
  X509_NAME *b;
  int iVar3;
  ulong i;
  X509_OBJECT obj;
  
  name = (X509_NAME *)X509_get_issuer_name(x);
  iVar3 = 1;
  iVar1 = X509_STORE_CTX_get_by_subject((X509_STORE_CTX *)ctx,1,name,&obj);
  if (iVar1 == 0) {
    iVar3 = 0;
  }
  else {
    iVar1 = x509_check_issued_with_callback((X509_STORE_CTX *)ctx,(X509 *)x,obj.data.x509);
    if (iVar1 == 0) {
      X509_OBJECT_free_contents((X509_OBJECT *)&obj);
      CRYPTO_MUTEX_lock_write((CRYPTO_MUTEX *)&ctx->ctx->objs);
      iVar3 = 1;
      iVar1 = X509_OBJECT_idx_by_subject(*(stack_st_X509_OBJECT **)ctx->ctx,1,(X509_NAME *)name);
      if (iVar1 == -1) {
LAB_002663a0:
        iVar3 = 0;
      }
      else {
        i = (ulong)iVar1;
        do {
          sVar2 = OPENSSL_sk_num(*(OPENSSL_STACK **)ctx->ctx);
          if (sVar2 <= i) goto LAB_002663a0;
          a = (X509_OBJECT *)OPENSSL_sk_value(*(OPENSSL_STACK **)ctx->ctx,i);
          if (a->type != 1) goto LAB_002663a0;
          b = X509_get_subject_name((a->data).x509);
          iVar1 = X509_NAME_cmp((X509_NAME *)name,b);
          if (iVar1 != 0) goto LAB_002663a0;
          iVar1 = x509_check_issued_with_callback
                            ((X509_STORE_CTX *)ctx,(X509 *)x,(X509 *)(a->data).x509);
          i = i + 1;
        } while (iVar1 == 0);
        *issuer = (X509 *)a->data;
        X509_OBJECT_up_ref_count(a);
      }
      CRYPTO_MUTEX_unlock_write((CRYPTO_MUTEX *)&ctx->ctx->objs);
    }
    else {
      *issuer = (X509 *)obj.data;
    }
  }
  return iVar3;
}

Assistant:

int X509_STORE_CTX_get1_issuer(X509 **out_issuer, X509_STORE_CTX *ctx,
                               X509 *x) {
  X509_NAME *xn;
  X509_OBJECT obj, *pobj;
  int idx, ret;
  size_t i;
  xn = X509_get_issuer_name(x);
  if (!X509_STORE_CTX_get_by_subject(ctx, X509_LU_X509, xn, &obj)) {
    return 0;
  }
  // If certificate matches all OK
  if (x509_check_issued_with_callback(ctx, x, obj.data.x509)) {
    *out_issuer = obj.data.x509;
    return 1;
  }
  X509_OBJECT_free_contents(&obj);

  // Else find index of first cert accepted by
  // |x509_check_issued_with_callback|.
  ret = 0;
  CRYPTO_MUTEX_lock_write(&ctx->ctx->objs_lock);
  idx = X509_OBJECT_idx_by_subject(ctx->ctx->objs, X509_LU_X509, xn);
  if (idx != -1) {  // should be true as we've had at least one
                    // match
    // Look through all matching certs for suitable issuer
    for (i = idx; i < sk_X509_OBJECT_num(ctx->ctx->objs); i++) {
      pobj = sk_X509_OBJECT_value(ctx->ctx->objs, i);
      // See if we've run past the matches
      if (pobj->type != X509_LU_X509) {
        break;
      }
      if (X509_NAME_cmp(xn, X509_get_subject_name(pobj->data.x509))) {
        break;
      }
      if (x509_check_issued_with_callback(ctx, x, pobj->data.x509)) {
        *out_issuer = pobj->data.x509;
        X509_OBJECT_up_ref_count(pobj);
        ret = 1;
        break;
      }
    }
  }
  CRYPTO_MUTEX_unlock_write(&ctx->ctx->objs_lock);
  return ret;
}